

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O3

uchar uriHexdigToIntW(wchar_t hexdig)

{
  if ((uint)(hexdig + L'\xffffffd0') < 0x37) {
    return (&DAT_001c9520)[(uint)(hexdig + L'\xffffffd0')];
  }
  return '\0';
}

Assistant:

unsigned char URI_FUNC(HexdigToInt)(URI_CHAR hexdig) {
	switch (hexdig) {
	case _UT('0'):
	case _UT('1'):
	case _UT('2'):
	case _UT('3'):
	case _UT('4'):
	case _UT('5'):
	case _UT('6'):
	case _UT('7'):
	case _UT('8'):
	case _UT('9'):
		return (unsigned char)(9 + hexdig - _UT('9'));

	case _UT('a'):
	case _UT('b'):
	case _UT('c'):
	case _UT('d'):
	case _UT('e'):
	case _UT('f'):
		return (unsigned char)(15 + hexdig - _UT('f'));

	case _UT('A'):
	case _UT('B'):
	case _UT('C'):
	case _UT('D'):
	case _UT('E'):
	case _UT('F'):
		return (unsigned char)(15 + hexdig - _UT('F'));

	default:
		return 0;
	}
}